

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O0

int flatcc_verify_union_table(flatcc_union_verifier_descriptor_t *ud,flatcc_table_verifier_f *tvf)

{
  int iVar1;
  flatcc_table_verifier_f *tvf_local;
  flatcc_union_verifier_descriptor_t *ud_local;
  
  iVar1 = verify_table(ud->buf,ud->end,ud->base,ud->offset,ud->ttl,tvf);
  return iVar1;
}

Assistant:

int flatcc_verify_union_table(flatcc_union_verifier_descriptor_t *ud, flatcc_table_verifier_f *tvf)
{
    return verify_table(ud->buf, ud->end, ud->base, ud->offset, ud->ttl, tvf);
}